

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void IsolatePhiNodes(VmModule *module,VmFunction *function)

{
  VmValue **ppVVar1;
  VmInstruction *replacement;
  char *pcVar2;
  uint uVar3;
  VmInstruction *pVVar4;
  VmBlock *pVVar5;
  VmInstruction *pVVar6;
  long lVar7;
  uint uVar8;
  VmBlock *pVVar9;
  ulong uVar10;
  VmValue *pVVar11;
  uint uVar12;
  VmValue *pVVar13;
  VmValue *pVVar14;
  VmValue *pVVar15;
  ulong uVar16;
  bool bVar17;
  VmType type;
  VmType type_00;
  SmallArray<VmInstruction_*,_16U> copyInstructions;
  VmValue *in_stack_ffffffffffffff28;
  SmallArray<VmInstruction_*,_16U> local_c8;
  
  pVVar5 = function->firstBlock;
  do {
    if (pVVar5 == (VmBlock *)0x0) {
      pVVar5 = function->firstBlock;
      do {
        if (pVVar5 == (VmBlock *)0x0) {
          return;
        }
        for (pVVar4 = pVVar5->firstInstruction; pVVar4 != (VmInstruction *)0x0;
            pVVar4 = pVVar4->nextSibling) {
          if (pVVar4->cmd == VM_INST_PHI) {
            uVar3 = (pVVar4->arguments).count;
            if (uVar3 != 0) {
              ppVVar1 = (pVVar4->arguments).data;
              uVar16 = 0;
              do {
                pVVar11 = ppVVar1[uVar16];
                if ((pVVar11 == (VmValue *)0x0) || (pVVar11->typeID != 2)) {
                  pVVar11 = (VmValue *)0x0;
                }
                uVar12 = (uint)uVar16 | 1;
                if (uVar3 <= uVar12) goto LAB_0028fd28;
                pVVar13 = ppVVar1[uVar12];
                if ((pVVar13 == (VmValue *)0x0) || (pVVar13->typeID != 3)) {
                  pVVar13 = (VmValue *)0x0;
                }
                uVar8 = (uint)uVar16 + 2;
                uVar16 = (ulong)uVar8;
                for (uVar12 = uVar8; uVar12 < uVar3; uVar12 = uVar12 + 2) {
                  pVVar14 = ppVVar1[uVar12];
                  if ((pVVar14 == (VmValue *)0x0) || (pVVar14->typeID != 2)) {
                    pVVar14 = (VmValue *)0x0;
                  }
                  if (uVar3 <= uVar12 + 1) goto LAB_0028fd28;
                  pVVar15 = ppVVar1[uVar12 + 1];
                  if ((pVVar15 == (VmValue *)0x0) || (pVVar15->typeID != 3)) {
                    pVVar15 = (VmValue *)0x0;
                  }
                  if ((pVVar11 == pVVar14) && (pVVar13 == pVVar15)) {
                    __assert_fail("instructionA != instructionB",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                  ,0x1ac0,"void IsolatePhiNodes(VmModule *, VmFunction *)");
                  }
                }
              } while (uVar8 < uVar3);
            }
            local_c8.allocator = module->allocator;
            local_c8.data = local_c8.little;
            local_c8.count = 0;
            local_c8.max = 0x10;
            uVar3 = (pVVar4->arguments).count;
            if (uVar3 != 0) {
              uVar12 = 0;
              do {
                ppVVar1 = (pVVar4->arguments).data;
                pVVar11 = ppVVar1[uVar12];
                if ((pVVar11 == (VmValue *)0x0) || (pVVar11->typeID != 2)) {
                  pVVar11 = (VmValue *)0x0;
                }
                if (uVar3 <= uVar12 + 1) {
LAB_0028fd28:
                  __assert_fail("index < count",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                ,0x199,
                                "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                               );
                }
                pVVar9 = (VmBlock *)ppVVar1[uVar12 + 1];
                if ((pVVar9 == (VmBlock *)0x0) || ((pVVar9->super_VmValue).typeID != 3)) {
                  pVVar9 = (VmBlock *)0x0;
                }
                module->currentBlock = pVVar9;
                pVVar9->insertPoint = pVVar9->lastInstruction->prevSibling;
                pVVar9->insertPoint = pVVar9->exitPc->prevSibling;
                type.structType = (TypeBase *)0x50;
                type._0_8_ = (pVVar11->type).structType;
                pVVar6 = anon_unknown.dwarf_233176::CreateInstruction
                                   ((anon_unknown_dwarf_233176 *)module,(VmModule *)0x0,
                                    *(SynBase **)&pVVar11->type,type,VM_INST_LOAD_BYTE,
                                    (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                                    in_stack_ffffffffffffff28);
                pcVar2 = (pVVar11->comment).end;
                (pVVar6->super_VmValue).comment.begin = (pVVar11->comment).begin;
                (pVVar6->super_VmValue).comment.end = pcVar2;
                VmInstruction::AddArgument(pVVar9->exitPc,&pVVar6->super_VmValue);
                VmInstruction::AddArgument(pVVar9->exitPc,pVVar11);
                VmValue::AddUse(&pVVar6->super_VmValue,&pVVar4->super_VmValue);
                if (((pVVar4->arguments).count <= uVar12) ||
                   (VmValue::RemoveUse((pVVar4->arguments).data[uVar12],&pVVar4->super_VmValue),
                   (pVVar4->arguments).count <= uVar12)) goto LAB_0028fd28;
                (pVVar4->arguments).data[uVar12] = &pVVar6->super_VmValue;
                pVVar9->insertPoint = pVVar9->lastInstruction;
                module->currentBlock = (VmBlock *)0x0;
                uVar12 = uVar12 + 2;
                uVar3 = (pVVar4->arguments).count;
              } while (uVar12 < uVar3);
            }
            module->currentBlock = pVVar5;
            pVVar6 = pVVar4;
            if (pVVar4->cmd == VM_INST_PHI) {
              do {
                pVVar6 = pVVar6->nextSibling;
                bVar17 = pVVar6 == (VmInstruction *)0x0;
                if (bVar17) {
                  pVVar5->insertPoint = (VmInstruction *)0x0;
                  goto LAB_0028fd6d;
                }
              } while (pVVar6->cmd == VM_INST_PHI);
            }
            else {
              bVar17 = false;
            }
            pVVar5->insertPoint = pVVar6;
            if (bVar17) {
LAB_0028fd6d:
              __assert_fail("block->insertPoint",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1aee,"void IsolatePhiNodes(VmModule *, VmFunction *)");
            }
            pVVar5->insertPoint = pVVar6->prevSibling;
            pVVar5->insertPoint = pVVar5->entryPc->prevSibling;
            type_00.structType = (TypeBase *)0x50;
            type_00._0_8_ = (pVVar4->super_VmValue).type.structType;
            pVVar6 = anon_unknown.dwarf_233176::CreateInstruction
                               ((anon_unknown_dwarf_233176 *)module,
                                (VmModule *)(pVVar4->super_VmValue).source,
                                *(SynBase **)&(pVVar4->super_VmValue).type,type_00,VM_INST_LOAD_BYTE
                                ,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                                in_stack_ffffffffffffff28);
            pcVar2 = (pVVar4->super_VmValue).comment.end;
            (pVVar6->super_VmValue).comment.begin = (pVVar4->super_VmValue).comment.begin;
            (pVVar6->super_VmValue).comment.end = pcVar2;
            VmInstruction::AddArgument(pVVar5->entryPc,&pVVar6->super_VmValue);
            (pVVar4->super_VmValue).canBeRemoved = false;
            anon_unknown.dwarf_233176::ReplaceValueUsersWith
                      (module,&pVVar4->super_VmValue,&pVVar6->super_VmValue,(uint *)0x0);
            VmInstruction::AddArgument(pVVar5->entryPc,&pVVar4->super_VmValue);
            (pVVar4->super_VmValue).canBeRemoved = true;
            pVVar5->insertPoint = pVVar5->lastInstruction;
            module->currentBlock = (VmBlock *)0x0;
            if (local_c8.count != 0) {
              uVar16 = 0;
              do {
                pVVar6 = local_c8.data[uVar16];
                for (pVVar9 = pVVar6->parent->idom; pVVar9 != (VmBlock *)0x0; pVVar9 = pVVar9->idom)
                {
                  if (local_c8.count != 0) {
                    uVar10 = 0;
                    bVar17 = false;
                    do {
                      if (uVar16 != uVar10) {
                        replacement = local_c8.data[uVar10];
                        lVar7 = 0;
                        if ((replacement->super_VmValue).users.count != 0) {
                          if (((pVVar6->arguments).count == 0) ||
                             ((replacement->arguments).count == 0)) goto LAB_0028fd28;
                          if ((*(pVVar6->arguments).data == *(replacement->arguments).data) &&
                             (lVar7 = 0, replacement->parent == pVVar9)) {
                            anon_unknown.dwarf_233176::ReplaceValueUsersWith
                                      (module,&pVVar6->super_VmValue,&replacement->super_VmValue,
                                       (uint *)0x0);
                            bVar17 = true;
                            lVar7 = 0x1e;
                          }
                        }
                        if (lVar7 != 0) break;
                      }
                      uVar10 = uVar10 + 1;
                    } while (uVar10 < (local_c8._8_8_ & 0xffffffff));
                    if (bVar17) break;
                  }
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 < (local_c8._8_8_ & 0xffffffff));
            }
            SmallArray<VmInstruction_*,_16U>::~SmallArray(&local_c8);
          }
        }
        pVVar5 = pVVar5->nextSibling;
      } while( true );
    }
    if (pVVar5->firstInstruction != (VmInstruction *)0x0) {
      module->currentBlock = pVVar5;
      pVVar5->insertPoint = pVVar5->lastInstruction->prevSibling;
      pVVar4 = anon_unknown.dwarf_233176::CreateInstruction
                         ((anon_unknown_dwarf_233176 *)module,(VmModule *)0x0,(SynBase *)0x0,
                          (VmType)(ZEXT816(0x51) << 0x40),VM_INST_LOAD_BYTE,(VmValue *)0x0,
                          (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,in_stack_ffffffffffffff28);
      pVVar5->exitPc = pVVar4;
      pVVar4 = pVVar5->firstInstruction;
      while( true ) {
        pVVar5->insertPoint = pVVar4;
        if (pVVar4 == (VmInstruction *)0x0) goto LAB_0028fd8c;
        if (pVVar4->cmd != VM_INST_PHI) break;
        pVVar4 = pVVar4->nextSibling;
      }
      if (pVVar4 == (VmInstruction *)0x0) {
LAB_0028fd8c:
        __assert_fail("block->insertPoint",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x1aa2,"void IsolatePhiNodes(VmModule *, VmFunction *)");
      }
      pVVar5->insertPoint = pVVar4->prevSibling;
      pVVar4 = anon_unknown.dwarf_233176::CreateInstruction
                         ((anon_unknown_dwarf_233176 *)module,(VmModule *)0x0,(SynBase *)0x0,
                          (VmType)(ZEXT816(0x51) << 0x40),VM_INST_LOAD_BYTE,(VmValue *)0x0,
                          (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,in_stack_ffffffffffffff28);
      pVVar5->entryPc = pVVar4;
      pVVar5->insertPoint = pVVar5->lastInstruction;
      module->currentBlock = (VmBlock *)0x0;
    }
    pVVar5 = pVVar5->nextSibling;
  } while( true );
}

Assistant:

void IsolatePhiNodes(VmModule *module, VmFunction* function)
{
	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		if(!block->firstInstruction)
			continue;

		// Insert empty parallel copy at the end of a block (before terminator)
		module->currentBlock = block;
		block->insertPoint = block->lastInstruction->prevSibling;

		block->exitPc = CreateInstruction(module, NULL, VmType::Void, VM_INST_PARALLEL_COPY, NULL, NULL, NULL, NULL);

		// Insert empty parallel copy at the start of a block (after phi instructions)
		block->insertPoint = block->firstInstruction;

		while(block->insertPoint && block->insertPoint->cmd == VM_INST_PHI)
			block->insertPoint = block->insertPoint->nextSibling;

		assert(block->insertPoint);

		block->insertPoint = block->insertPoint->prevSibling;

		block->entryPc = CreateInstruction(module, NULL, VmType::Void, VM_INST_PARALLEL_COPY, NULL, NULL, NULL, NULL);

		block->insertPoint = block->lastInstruction;
		module->currentBlock = NULL;
	}

	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		for(VmInstruction *inst = block->firstInstruction; inst; inst = inst->nextSibling)
		{
			// For each phi node
			if(inst->cmd == VM_INST_PHI)
			{
#if !defined(NDEBUG)
				// Avoid surprises, each edge might introduce only a single variable
				for(unsigned argumentA = 0; argumentA < inst->arguments.size(); argumentA += 2)
				{
					VmInstruction *instructionA = getType<VmInstruction>(inst->arguments[argumentA]);
					VmBlock *edgeA = getType<VmBlock>(inst->arguments[argumentA + 1]);

					for(unsigned argumentB = argumentA + 2; argumentB < inst->arguments.size(); argumentB += 2)
					{
						VmInstruction *instructionB = getType<VmInstruction>(inst->arguments[argumentB]);
						VmBlock *edgeB = getType<VmBlock>(inst->arguments[argumentB + 1]);

						if(edgeA == edgeB)
							assert(instructionA != instructionB);
					}
				}
#endif

				SmallArray<VmInstruction*, 16> copyInstructions(module->allocator);

				// Introduce a copy at the end of the predecessor block
				for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
				{
					VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);
					VmBlock *edge = getType<VmBlock>(inst->arguments[argument + 1]);

					// In a general case if instruction set contains instructions that modify the value after the branch, it won't be valid to insert a copy

					// Place copy before the terminator instruction
					module->currentBlock = edge;
					edge->insertPoint = edge->lastInstruction->prevSibling;

					edge->insertPoint = edge->exitPc->prevSibling;

					VmInstruction *def = CreateInstruction(module, NULL, instruction->type, VM_INST_DEF, NULL, NULL, NULL, NULL);

					def->comment = instruction->comment;

					edge->exitPc->AddArgument(def);
					edge->exitPc->AddArgument(instruction);

					def->AddUse(inst);
					inst->arguments[argument]->RemoveUse(inst);

					inst->arguments[argument] = def;

					edge->insertPoint = edge->lastInstruction;
					module->currentBlock = NULL;
				}

				// In general case if optimization passes create multiple incoming edges from a single block, it won't be valid to insert a copy

				// Introduce a copy right after the phi node
				module->currentBlock = block;
				block->insertPoint = inst;

				while(block->insertPoint && block->insertPoint->cmd == VM_INST_PHI)
					block->insertPoint = block->insertPoint->nextSibling;

				assert(block->insertPoint);

				block->insertPoint = block->insertPoint->prevSibling;

				block->insertPoint = block->entryPc->prevSibling;

				VmInstruction *def = CreateInstruction(module, inst->source, inst->type, VM_INST_DEF, NULL, NULL, NULL, NULL);

				def->comment = inst->comment;

				block->entryPc->AddArgument(def);

				inst->canBeRemoved = false;

				ReplaceValueUsersWith(module, inst, def, NULL);

				block->entryPc->AddArgument(inst);

				inst->canBeRemoved = true;

				block->insertPoint = block->lastInstruction;
				module->currentBlock = NULL;

				// Remove redundant copies
				for(unsigned i = 0; i < copyInstructions.size(); i++)
				{
					VmInstruction *copyA = copyInstructions[i];
					VmBlock *parentA = copyA->parent;

					for(VmBlock *curr = parentA->idom; curr; curr = curr->idom)
					{
						bool replaced = false;

						for(unsigned k = 0; k < copyInstructions.size(); k++)
						{
							if(i == k)
								continue;

							VmInstruction *copyB = copyInstructions[k];

							// Check if already dead
							if(copyB->users.empty())
								continue;

							// Check if the copy is the same
							if(copyA->arguments[0] != copyB->arguments[0])
								continue;

							VmBlock *parentB = copyB->parent;

							// If immediate dominator contains the same copy, use it
							if(parentB == curr)
							{
								ReplaceValueUsersWith(module, copyA, copyB, NULL);
								replaced = true;
								break;
							}
						}

						if(replaced)
							break;
					}
				}
			}
		}
	}
}